

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_xmlmodelserialiser.cpp
# Opt level: O1

void __thiscall tst_XmlModelSerialiser::autoParent(tst_XmlModelSerialiser *this)

{
  char cVar1;
  QObject *this_00;
  XmlModelSerialiser *this_01;
  QSignalSpy testItemDestroyedSpy;
  QSignalSpy local_98;
  
  this_00 = (QObject *)operator_new(0x10);
  QObject::QObject(this_00,(QObject *)0x0);
  this_01 = (XmlModelSerialiser *)operator_new(0x18);
  XmlModelSerialiser::XmlModelSerialiser(this_01,this_00);
  QSignalSpy::QSignalSpy(&local_98,(QObject *)this_01,"2destroyed(QObject *)");
  cVar1 = QTest::qVerify(local_98.sig.d.size != 0,"testItemDestroyedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                         ,0xf);
  if (cVar1 != '\0') {
    (**(code **)(*(long *)this_00 + 0x20))(this_00);
    QTest::qCompare(local_98.super_QList<QList<QVariant>_>.d.size,1,"testItemDestroyedSpy.count()",
                    "1",
                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                    ,0x11);
  }
  local_98._0_8_ = &PTR_metaObject_0010fc10;
  QObject::~QObject((QObject *)((long)&local_98 + 0x58));
  if (&(local_98.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_98.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_98 + 0x10));
  QObject::~QObject(&local_98.super_QObject);
  return;
}

Assistant:

void tst_XmlModelSerialiser::autoParent()
{
    QObject *parentObj = new QObject;
    auto testItem = new XmlModelSerialiser(parentObj);
    QSignalSpy testItemDestroyedSpy(testItem, SIGNAL(destroyed(QObject *)));
    QVERIFY(testItemDestroyedSpy.isValid());
    delete parentObj;
    QCOMPARE(testItemDestroyedSpy.count(), 1);
}